

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_allocator.cpp
# Opt level: O1

void __thiscall
duckdb::FixedSizeAllocator::Init(FixedSizeAllocator *this,FixedSizeAllocatorInfo *info)

{
  idx_t segment_count;
  idx_t allocation_size;
  BlockManager *block_manager;
  _Head_base<0UL,_duckdb::FixedSizeBuffer_*,_false> this_00;
  pointer puVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  _Head_base<0UL,_duckdb::FixedSizeBuffer_*,_false> this_01;
  mapped_type *pmVar4;
  InternalException *this_02;
  size_type __n;
  __hashtable *__h;
  unsigned_long *buffer_id_1;
  pointer puVar5;
  value_type buffer_block_pointer;
  value_type buffer_id;
  string local_88;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_68;
  vector<unsigned_long,_true> *local_60;
  vector<unsigned_long,_true> *local_58;
  vector<duckdb::BlockPointer,_true> *local_50;
  ulong local_48;
  vector<unsigned_long,_true> *local_40;
  ulong local_38;
  
  this->segment_size = info->segment_size;
  this->total_segment_count = 0;
  if ((info->buffer_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (info->buffer_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_40 = &info->buffer_ids;
    local_48 = 0x7ffffffffff080;
    local_50 = &info->block_pointers;
    local_58 = &info->segment_counts;
    local_60 = &info->allocation_sizes;
    local_68 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&this->buffers;
    __n = 0;
    do {
      pvVar2 = vector<unsigned_long,_true>::operator[](local_40,__n);
      local_38 = *pvVar2;
      if (local_48 < local_38) {
        this_02 = (InternalException *)__cxa_allocate_exception(0x10);
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_88,"Initializing invalid buffer ID in FixedSizeAllocator::Init",
                   "");
        InternalException::InternalException(this_02,&local_88);
        __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pvVar3 = vector<duckdb::BlockPointer,_true>::operator[](local_50,__n);
      local_88._M_dataplus._M_p = (pointer)pvVar3->block_id;
      local_88._M_string_length._0_4_ = pvVar3->offset;
      local_88._M_string_length._4_4_ = pvVar3->unused_padding;
      pvVar2 = vector<unsigned_long,_true>::operator[](local_58,__n);
      segment_count = *pvVar2;
      pvVar2 = vector<unsigned_long,_true>::operator[](local_60,__n);
      allocation_size = *pvVar2;
      block_manager = this->block_manager;
      this_01._M_head_impl = (FixedSizeBuffer *)operator_new(0x80);
      FixedSizeBuffer::FixedSizeBuffer
                (this_01._M_head_impl,block_manager,segment_count,allocation_size,
                 (BlockPointer *)&local_88);
      pmVar4 = ::std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[](local_68,&local_38);
      this_00._M_head_impl =
           (pmVar4->
           super_unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::FixedSizeBuffer_*,_std::default_delete<duckdb::FixedSizeBuffer>_>
           .super__Head_base<0UL,_duckdb::FixedSizeBuffer_*,_false>._M_head_impl;
      (pmVar4->
      super_unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>_>)._M_t
      .super___uniq_ptr_impl<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::FixedSizeBuffer_*,_std::default_delete<duckdb::FixedSizeBuffer>_>
      .super__Head_base<0UL,_duckdb::FixedSizeBuffer_*,_false>._M_head_impl = this_01._M_head_impl;
      if (this_00._M_head_impl != (FixedSizeBuffer *)0x0) {
        FixedSizeBuffer::~FixedSizeBuffer(this_00._M_head_impl);
        operator_delete(this_00._M_head_impl);
      }
      this->total_segment_count = this->total_segment_count + segment_count;
      __n = __n + 1;
    } while (__n < (ulong)((long)(info->buffer_ids).
                                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)(info->buffer_ids).
                                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  puVar5 = (info->buffers_with_free_space).
           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (info->buffers_with_free_space).
           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar5 != puVar1) {
    do {
      local_88._M_dataplus._M_p = (pointer)&this->buffers_with_free_space;
      ::std::
      _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&this->buffers_with_free_space,puVar5,&local_88);
      puVar5 = puVar5 + 1;
    } while (puVar5 != puVar1);
  }
  NextBufferWithFreeSpace(this);
  return;
}

Assistant:

void FixedSizeAllocator::Init(const FixedSizeAllocatorInfo &info) {
	segment_size = info.segment_size;
	total_segment_count = 0;

	for (idx_t i = 0; i < info.buffer_ids.size(); i++) {

		// read all FixedSizeBuffer data
		auto buffer_id = info.buffer_ids[i];

		// Memory safety check.
		if (buffer_id > idx_t(MAX_ROW_ID)) {
			throw InternalException("Initializing invalid buffer ID in FixedSizeAllocator::Init");
		}

		auto buffer_block_pointer = info.block_pointers[i];
		auto segment_count = info.segment_counts[i];
		auto allocation_size = info.allocation_sizes[i];

		// create the FixedSizeBuffer
		buffers[buffer_id] =
		    make_uniq<FixedSizeBuffer>(block_manager, segment_count, allocation_size, buffer_block_pointer);
		total_segment_count += segment_count;
	}

	for (const auto &buffer_id : info.buffers_with_free_space) {
		buffers_with_free_space.insert(buffer_id);
	}
	NextBufferWithFreeSpace();
}